

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall Rml::DataViewVisible::Update(DataViewVisible *this,DataModel *model)

{
  bool bVar1;
  Element *element;
  DataExpression *this_00;
  PropertyMap *this_01;
  size_t sVar2;
  bool bVar3;
  Variant variant;
  DataExpressionInterface expr_interface;
  Property local_70;
  
  Variant::Variant(&variant);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&expr_interface,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar1 = DataExpression::Run(this_00,&expr_interface,&variant);
    if (bVar1) {
      bVar1 = Variant::Get<bool>(&variant,false);
      this_01 = Element::GetLocalStyleProperties(element);
      local_70.value.type._0_1_ = VOIDPTR;
      sVar2 = robin_hood::detail::
              Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
              ::count(this_01,(key_type *)&local_70);
      bVar3 = (sVar2 != 0) == bVar1;
      if (bVar3) {
        if (bVar1) {
          Element::RemoveProperty(element,Visibility);
        }
        else {
          Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>(&local_70,Hidden);
          Element::SetProperty(element,Visibility,&local_70);
          Property::~Property(&local_70);
        }
      }
      goto LAB_0026f0b9;
    }
  }
  bVar3 = false;
LAB_0026f0b9:
  Variant::~Variant(&variant);
  return bVar3;
}

Assistant:

bool DataViewVisible::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const bool value = variant.Get<bool>();
		const bool is_visible = (element->GetLocalStyleProperties().count(PropertyId::Visibility) == 0);
		if (is_visible != value)
		{
			if (value)
				element->RemoveProperty(PropertyId::Visibility);
			else
				element->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));
			result = true;
		}
	}
	return result;
}